

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall
CLIntercept::getContextPropertiesString
          (CLIntercept *this,cl_context_properties *properties,string *str)

{
  ulong uVar1;
  long lVar2;
  char *__format;
  cl_int e;
  long *plVar3;
  string platformInfo;
  char s [256];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string local_158;
  char local_138 [264];
  
  std::__cxx11::string::assign((char *)str);
  if (properties == (cl_context_properties *)0x0) {
    std::__cxx11::string::assign((char *)str);
    return;
  }
  plVar3 = properties + 2;
  do {
    uVar1 = plVar3[-2];
    if (uVar1 == 0) {
      return;
    }
    e = (cl_int)uVar1;
    CEnumNameMap::name_abi_cxx11_(&local_158,&this->m_EnumNameMap,e);
    std::operator+(&local_178,&local_158," = ");
    std::__cxx11::string::append((string *)str);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_158);
    if (e - 0x2008U < 5) {
LAB_0015d154:
      lVar2 = plVar3[-1];
      __format = "%p";
LAB_0015d16c:
      snprintf(local_138,0x100,__format,lVar2);
LAB_0015d179:
      std::__cxx11::string::append((char *)str);
    }
    else {
      if (e == 0x1084) {
        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        local_178._M_string_length = 0;
        local_178.field_2._M_local_buf[0] = '\0';
        getPlatformInfoString(this,(cl_platform_id)plVar3[-1],&local_178);
        std::__cxx11::string::append((string *)str);
      }
      else {
        if ((e != 0x1085) && (e != 0x2032)) {
          if (e == 0x40b0) goto LAB_0015d154;
          if (e == 0x40b1) {
            lVar2 = plVar3[-1];
            __format = "%zu";
            goto LAB_0015d16c;
          }
          snprintf(local_138,0x100,"<Unknown %08X!>",uVar1 & 0xffffffff);
          goto LAB_0015d179;
        }
        CEnumNameMap::name_bool_abi_cxx11_
                  (&local_178,&this->m_EnumNameMap,*(cl_bool *)(plVar3 + -1));
        std::__cxx11::string::append((string *)str);
      }
      std::__cxx11::string::~string((string *)&local_178);
    }
    if (*plVar3 != 0) {
      std::__cxx11::string::append((char *)str);
    }
    plVar3 = plVar3 + 2;
  } while( true );
}

Assistant:

void CLIntercept::getContextPropertiesString(
    const cl_context_properties* properties,
    std::string& str ) const
{
    str = "";

    if( properties )
    {
        char    s[256];

        while( properties[0] != 0 )
        {
            cl_int  property = (cl_int)properties[0];
            str += enumName().name( property ) + " = ";

            switch( property )
            {
            case CL_CONTEXT_PLATFORM:
                {
                    const cl_platform_id* pp = (const cl_platform_id*)( properties + 1 );
                    const cl_platform_id  platform = pp[0];
                    std::string platformInfo;
                    getPlatformInfoString( platform, platformInfo );
                    str += platformInfo;
                }
                break;
            case CL_GL_CONTEXT_KHR:
            case CL_EGL_DISPLAY_KHR:
            case CL_GLX_DISPLAY_KHR:
            case CL_WGL_HDC_KHR:
            case CL_CGL_SHAREGROUP_KHR:
#if defined(_WIN32)
            case CL_CONTEXT_D3D10_DEVICE_KHR:
            case CL_CONTEXT_D3D11_DEVICE_KHR:
            case CL_CONTEXT_ADAPTER_D3D9_KHR:
            case CL_CONTEXT_ADAPTER_D3D9EX_KHR:
            case CL_CONTEXT_ADAPTER_DXVA_KHR:
#endif
            case CL_PRINTF_CALLBACK_ARM:
                {
                    const void** pp = (const void**)( properties + 1 );
                    const void*  value = pp[0];
                    CLI_SPRINTF( s, 256, "%p", value );
                    str += s;
                }
                break;
            case CL_CONTEXT_INTEROP_USER_SYNC:
            case CL_CONTEXT_TERMINATE_KHR:
                {
                    const cl_bool*  pb = (const cl_bool*)( properties + 1);
                    cl_bool value = pb[0];
                    str += enumName().name_bool( value );
                }
                break;
            case CL_PRINTF_BUFFERSIZE_ARM:
                {
                    const size_t*   psz = (const size_t*)( properties + 1);
                    size_t value = psz[0];
                    CLI_SPRINTF( s, 256, "%zu", value );
                    str += s;
                }
                break;
            case CL_CONTEXT_MEMORY_INITIALIZE_KHR:
                // TODO: this is a cl_context_memory_initialize_khr bitfield.
                // Fall through for now.
            default:
                {
                    CLI_SPRINTF( s, 256, "<Unknown %08X!>", (cl_uint)property );
                    str += s;
                }
                break;
            }

            properties += 2;
            if( properties[0] != 0 )
            {
                str += ", ";
            }
        }
    }
    else
    {
        str = "NULL";
    }
}